

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O1

int ffukyj(fitsfile *fptr,char *keyname,LONGLONG value,char *comm,int *status)

{
  int iVar1;
  int iVar2;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    iVar1 = ffmkyj(fptr,keyname,value,comm,status);
    if (iVar1 == 0xca) {
      *status = iVar2;
      ffpkyj(fptr,keyname,value,comm,status);
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffukyj(fitsfile *fptr,     /* I - FITS file pointer  */
           const char *keyname,/* I - keyword name       */
           LONGLONG value,     /* I - keyword value      */
           const char *comm,   /* I - keyword comment    */
           int *status)        /* IO - error status      */
{
    int tstatus;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    tstatus = *status;

    if (ffmkyj(fptr, keyname, value, comm, status) == KEY_NO_EXIST)
    {
        *status = tstatus;
        ffpkyj(fptr, keyname, value, comm, status);
    }
    return(*status);
}